

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTryExpr(BinaryReaderInterp *this,Type sig_type)

{
  pointer pTVar1;
  pointer pTVar2;
  FuncDesc *pFVar3;
  Result RVar4;
  Offset OVar5;
  Enum EVar6;
  u32 exn_stack_height;
  Location loc;
  Index local_6c;
  undefined1 local_68 [16];
  anon_union_16_2_ecfd7102_for_Location_1 local_58;
  pointer local_48;
  anon_union_4_2_59e55c6f_for_HandlerDesc_4 local_40;
  u32 local_3c;
  Index local_38;
  
  RVar4 = TypeChecker::GetCatchCount
                    (&(this->validator_).typechecker_,
                     (int)((ulong)((long)(this->label_stack_).
                                         super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->label_stack_).
                                        super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1,
                     &local_6c);
  EVar6 = Error;
  if (RVar4.enum_ != Error) {
    pTVar1 = (this->validator_).typechecker_.type_stack_.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar2 = (this->validator_).typechecker_.type_stack_.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_58._8_8_ = (ulong)(uint)local_58._12_4_ << 0x20;
    local_68._0_8_ = (this->filename_)._M_len;
    local_68._8_8_ = (this->filename_)._M_str;
    local_58.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    RVar4 = SharedValidator::OnTry(&this->validator_,(Location *)local_68,sig_type);
    if (RVar4.enum_ != Error) {
      PushLabel(this,Try,0xffffffff,0xffffffff,
                (int)((ulong)((long)(this->func_->handlers).
                                    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->func_->handlers).
                                   super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249);
      pFVar3 = this->func_;
      local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
      OVar5 = Istream::end(this->istream_);
      local_68._4_4_ = OVar5;
      local_68._8_4_ = 0xffffffff;
      local_58.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      local_58._8_8_ = 0;
      local_48 = (pointer)0x0;
      local_40.catch_all_offset = 0xffffffff;
      local_3c = (u32)((ulong)((long)pTVar2 - (long)pTVar1) >> 3);
      local_38 = local_6c;
      std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
      emplace_back<wabt::interp::HandlerDesc>(&pFVar3->handlers,(HandlerDesc *)local_68);
      if (local_58.field_1.offset != 0) {
        operator_delete((void *)local_58.field_1.offset,(long)local_48 - local_58._0_8_);
      }
      EVar6 = Ok;
    }
  }
  return (Result)EVar6;
}

Assistant:

Result BinaryReaderInterp::OnTryExpr(Type sig_type) {
  u32 exn_stack_height;
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &exn_stack_height));
  u32 value_stack_height = validator_.type_stack_size();
  CHECK_RESULT(validator_.OnTry(GetLocation(), sig_type));
  // Push a label that tracks mapping of exn -> catch
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset,
            func_->handlers.size());
  func_->handlers.push_back(HandlerDesc{HandlerKind::Catch,
                                        istream_.end(),
                                        Istream::kInvalidOffset,
                                        {},
                                        {Istream::kInvalidOffset},
                                        value_stack_height,
                                        exn_stack_height});
  return Result::Ok;
}